

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveProxy.cpp
# Opt level: O3

bool __thiscall
aeron::archive::ArchiveProxy::listRecordings
          (ArchiveProxy *this,int64_t fromRecordingId,int32_t recordCount,int64_t correlationId,
          int64_t controlSessionId)

{
  bool bVar1;
  ListRecordingsRequest *pLVar2;
  int64_t val;
  int32_t val_3;
  int64_t val_1;
  int64_t val_2;
  ListRecordingsRequest msg;
  ListRecordingsRequest local_68;
  
  local_68.m_offset = 0;
  local_68.m_buffer = (char *)0x0;
  local_68.m_bufferLength = 0;
  pLVar2 = wrapAndApplyHeader<io::aeron::archive::codecs::ListRecordingsRequest>(this,&local_68);
  *(int64_t *)(pLVar2->m_buffer + pLVar2->m_offset) = controlSessionId;
  *(int64_t *)(pLVar2->m_buffer + pLVar2->m_offset + 8) = correlationId;
  *(int64_t *)(pLVar2->m_buffer + pLVar2->m_offset + 0x10) = fromRecordingId;
  *(int32_t *)(pLVar2->m_buffer + pLVar2->m_offset + 0x18) = recordCount;
  bVar1 = offer(this,(int)local_68.m_position - (int)local_68.m_offset);
  return bVar1;
}

Assistant:

bool ArchiveProxy::listRecordings(std::int64_t fromRecordingId, std::int32_t recordCount, std::int64_t correlationId,
                                  std::int64_t controlSessionId) {
    codecs::ListRecordingsRequest msg;

    wrapAndApplyHeader(msg)
        .controlSessionId(controlSessionId)
        .correlationId(correlationId)
        .fromRecordingId(fromRecordingId)
        .recordCount(recordCount);

    return offer(msg.encodedLength());
}